

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O0

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>_>
::~DependentQuantityD
          (DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>_>
           *this)

{
  void *in_RDI;
  
  ~DependentQuantityD((DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>_>
                       *)0x2beca8);
  operator_delete(in_RDI);
  return;
}

Assistant:

DependentQuantityD(){}